

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsInput
helicsFederateRegisterGlobalTypeInput
          (HelicsFederate fed,char *key,char *type,char *units,HelicsError *err)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *puVar2;
  string_view units_00;
  ulong uVar3;
  ValueFederate *pVVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  InputObject *pIVar6;
  size_t sVar7;
  Input *pIVar8;
  ulong uVar9;
  const_iterator __position;
  _Alloc_hider _Var10;
  _Alloc_hider _Var11;
  FedObject *fedObj;
  string_view name;
  string_view type_00;
  _Head_base<0UL,_helics::InputObject_*,_false> local_80;
  InputObject *local_78;
  size_type local_70;
  ValueFederate *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  char *local_50;
  HelicsError *local_48;
  size_t local_40;
  char *pcStack_38;
  
  local_48 = err;
  getValueFedSharedPtr(&local_68,(HelicsError *)fed);
  pVVar4 = local_68;
  if (local_68 == (ValueFederate *)0x0) {
    pIVar6 = (InputObject *)0x0;
  }
  else {
    pIVar6 = (InputObject *)operator_new(0x20);
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pIVar6->inputPtr = (Input *)0x0;
    *(undefined8 *)pIVar6 = 0;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_70 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var11 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    local_78 = pIVar6;
    if (key != (char *)0x0) {
      local_70 = strlen(key);
      _Var11._M_p = key;
    }
    sVar7 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var10._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (type != (char *)0x0) {
      sVar7 = strlen(type);
      _Var10._M_p = type;
    }
    local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    pcStack_38 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (units != (char *)0x0) {
      local_50 = units;
      local_40 = strlen(units);
      pcStack_38 = local_50;
    }
    units_00._M_str = pcStack_38;
    units_00._M_len = local_40;
    name._M_str = _Var11._M_p;
    name._M_len = local_70;
    type_00._M_str = _Var10._M_p;
    type_00._M_len = sVar7;
    pIVar8 = helics::ValueFederate::registerGlobalInput(pVVar4,name,type_00,units_00);
    p_Var5 = p_Stack_60;
    pVVar4 = local_68;
    pIVar6->inputPtr = pIVar8;
    local_68 = (ValueFederate *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pVVar4;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      pIVar6 = local_78;
    }
    local_78 = (InputObject *)0x0;
    pIVar6->valid = 0x3456e052;
    __position._M_current =
         *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
          ((long)fed + 0x50);
    puVar2 = *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
              ((long)fed + 0x58);
    local_80._M_head_impl = pIVar6;
    if ((__position._M_current == puVar2) ||
       (iVar1 = (pIVar6->inputPtr->super_Interface).handle.hid,
       ((puVar2[-1]._M_t.
         super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>._M_t.
         super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
         super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
       super_Interface).handle.hid < iVar1)) {
      std::
      vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
      ::emplace_back<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>
                ((vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
                  *)((long)fed + 0x50),
                 (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
                 &local_80);
    }
    else {
      uVar9 = (long)puVar2 - (long)__position._M_current >> 3;
      while (uVar3 = uVar9, 0 < (long)uVar3) {
        uVar9 = uVar3 >> 1;
        if (((__position._M_current[uVar9]._M_t.
              super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>.
              _M_t.
              super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>
              .super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
            super_Interface).handle.hid <= iVar1) {
          __position._M_current = __position._M_current + uVar9 + 1;
          uVar9 = ~uVar9 + uVar3;
        }
      }
      std::
      vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
                        *)((long)fed + 0x50),__position,(value_type *)&local_80);
    }
    if (local_80._M_head_impl != (InputObject *)0x0) {
      std::default_delete<helics::InputObject>::operator()
                ((default_delete<helics::InputObject> *)&local_80,local_80._M_head_impl);
    }
    local_80._M_head_impl = (InputObject *)0x0;
    if (local_78 != (InputObject *)0x0) {
      std::default_delete<helics::InputObject>::operator()
                ((default_delete<helics::InputObject> *)&local_78,local_78);
    }
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  return pIVar6;
}

Assistant:

HelicsInput
    helicsFederateRegisterGlobalTypeInput(HelicsFederate fed, const char* key, const char* type, const char* units, HelicsError* err)
{
    // now generate a generic input
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto inp = std::make_unique<helics::InputObject>();
        inp->inputPtr = &(fedObj->registerGlobalInput(AS_STRING_VIEW(key), AS_STRING_VIEW(type), AS_STRING_VIEW(units)));
        inp->fedptr = std::move(fedObj);
        return addInput(fed, std::move(inp));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}